

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmap_disk_io.cpp
# Opt level: O0

void __thiscall libtorrent::mmap_disk_io::execute_job(mmap_disk_io *this,mmap_disk_job *j)

{
  bool bVar1;
  tailqueue<libtorrent::aux::disk_job> local_90;
  tailqueue<libtorrent::aux::disk_job> local_78;
  error_code local_60;
  storage_error local_50;
  undefined1 local_33;
  uchar local_32;
  bitfield_flag local_31;
  undefined1 local_30 [8];
  jobqueue_t completed_jobs;
  mmap_disk_job *j_local;
  mmap_disk_io *this_local;
  
  completed_jobs._16_8_ = j;
  libtorrent::aux::tailqueue<libtorrent::aux::disk_job>::tailqueue
            ((tailqueue<libtorrent::aux::disk_job> *)local_30);
  local_32 = *(uchar *)(completed_jobs._16_8_ + 8);
  local_33 = 0x40;
  local_31 = (bitfield_flag)
             libtorrent::flags::operator&
                       ((bitfield_flag<unsigned_char,_libtorrent::disk_job_flags_tag,_void>)local_32
                        ,(bitfield_flag<unsigned_char,_libtorrent::disk_job_flags_tag,_void>)0x40);
  bVar1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(&local_31);
  if (bVar1) {
    *(undefined1 *)(completed_jobs._16_8_ + 9) = 1;
    boost::system::error_code::error_code<boost::asio::error::basic_errors>
              (&local_60,operation_aborted,(type *)0x0);
    storage_error::storage_error(&local_50,local_60);
    *(undefined8 *)(completed_jobs._16_8_ + 0x10) = local_50.ec._0_8_;
    *(error_category **)(completed_jobs._16_8_ + 0x18) = local_50.ec.cat_;
    *(undefined4 *)(completed_jobs._16_8_ + 0x20) = local_50._16_4_;
    libtorrent::aux::tailqueue<libtorrent::aux::disk_job>::push_back
              ((tailqueue<libtorrent::aux::disk_job> *)local_30,(disk_job *)completed_jobs._16_8_);
    libtorrent::aux::tailqueue<libtorrent::aux::disk_job>::tailqueue
              (&local_78,(tailqueue<libtorrent::aux::disk_job> *)local_30);
    add_completed_jobs(this,&local_78);
  }
  else {
    perform_job(this,(mmap_disk_job *)completed_jobs._16_8_,(jobqueue_t *)local_30);
    bVar1 = libtorrent::aux::tailqueue<libtorrent::aux::disk_job>::empty
                      ((tailqueue<libtorrent::aux::disk_job> *)local_30);
    if (!bVar1) {
      libtorrent::aux::tailqueue<libtorrent::aux::disk_job>::tailqueue
                (&local_90,(tailqueue<libtorrent::aux::disk_job> *)local_30);
      add_completed_jobs(this,&local_90);
    }
  }
  return;
}

Assistant:

void mmap_disk_io::execute_job(aux::mmap_disk_job* j)
	{
		jobqueue_t completed_jobs;
		if (j->flags & aux::disk_job::aborted)
		{
			j->ret = disk_status::fatal_disk_error;
			j->error = storage_error(boost::asio::error::operation_aborted);
			completed_jobs.push_back(j);
			add_completed_jobs(std::move(completed_jobs));
			return;
		}

		perform_job(j, completed_jobs);
		if (!completed_jobs.empty())
			add_completed_jobs(std::move(completed_jobs));
	}